

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::GayBerneAdapter::makeGayBerne
          (GayBerneAdapter *this,RealType d,RealType l,RealType eps_X,RealType eps_S,RealType eps_E,
          RealType dw)

{
  AtomType *this_00;
  bool bVar1;
  GBAtypeParameters gbParam;
  undefined1 local_99;
  SimpleTypeData<OpenMD::GBAtypeParameters> *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  RealType local_88;
  RealType local_80;
  RealType local_78;
  RealType local_70;
  RealType local_68;
  RealType local_60;
  shared_ptr<OpenMD::GenericData> local_58;
  GBAtypeParameters local_48;
  
  local_88 = d;
  local_80 = l;
  local_78 = eps_X;
  local_70 = eps_S;
  local_68 = eps_E;
  local_60 = dw;
  bVar1 = AtomType::hasProperty(this->at_,(string *)GBtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)GBtypeID_abi_cxx11_);
  }
  local_48.GB_d = local_88;
  local_48.GB_l = local_80;
  local_48.GB_eps_X = local_78;
  local_48.GB_eps_S = local_70;
  local_48.GB_eps_E = local_68;
  local_48.GB_dw = local_60;
  this_00 = this->at_;
  local_98 = (SimpleTypeData<OpenMD::GBAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>>,std::__cxx11::string_const&,OpenMD::GBAtypeParameters&>
            (&_Stack_90,&local_98,
             (allocator<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *)&local_99,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             GBtypeID_abi_cxx11_,&local_48);
  local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_98->super_GenericData;
  local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  local_98 = (SimpleTypeData<OpenMD::GBAtypeParameters> *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_58);
  if (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  return;
}

Assistant:

void GayBerneAdapter::makeGayBerne(RealType d, RealType l, RealType eps_X,
                                     RealType eps_S, RealType eps_E,
                                     RealType dw) {
    if (isGayBerne()) { at_->removeProperty(GBtypeID); }

    GBAtypeParameters gbParam {};
    gbParam.GB_d     = d;
    gbParam.GB_l     = l;
    gbParam.GB_eps_X = eps_X;
    gbParam.GB_eps_S = eps_S;
    gbParam.GB_eps_E = eps_E;
    gbParam.GB_dw    = dw;

    at_->addProperty(std::make_shared<GBAtypeData>(GBtypeID, gbParam));
  }